

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::precomputeWordVectors(FastText *this,Matrix *wordVectors)

{
  int32_t iVar1;
  long i;
  real rVar2;
  Vector vec;
  string word;
  Vector local_68;
  string local_50;
  
  Vector::Vector(&local_68,
                 (long)((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->dim);
  Matrix::zero(wordVectors);
  i = 0;
  while( true ) {
    iVar1 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    if (iVar1 <= i) break;
    Dictionary::getWord_abi_cxx11_
              (&local_50,
               (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(int32_t)i);
    getWordVector(this,&local_68,&local_50);
    rVar2 = Vector::norm(&local_68);
    if (0.0 < rVar2) {
      Matrix::addRow(wordVectors,&local_68,i,1.0 / rVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    i = i + 1;
  }
  if (local_68.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::precomputeWordVectors(Matrix& wordVectors) {
  Vector vec(args_->dim);
  wordVectors.zero();
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    real norm = vec.norm();
    if (norm > 0) {
      wordVectors.addRow(vec, i, 1.0 / norm);
    }
  }
}